

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md_parser.cpp
# Opt level: O1

void __thiscall MdParser::parse(MdParser *this)

{
  undefined1 *puVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  Document *this_00;
  istream *piVar7;
  Paragraph *pPVar8;
  long lVar9;
  CodeLineElement *this_01;
  code *pcVar10;
  Paragraph *this_02;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  string line;
  smatch match;
  regex olist1_regex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  MdParser *local_170;
  string local_168;
  code *local_148;
  LineElement *local_140;
  code *local_138;
  code *local_130;
  long *local_128 [2];
  long local_118 [2];
  code *local_108;
  code *local_100;
  code *local_f8;
  code *local_f0;
  code *local_e8;
  code *local_e0;
  long *local_d8;
  ulong local_d0;
  long local_c8 [2];
  long *local_b8;
  ulong local_b0;
  long local_a8 [2];
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_98;
  long *local_70;
  long local_68;
  long local_60 [2];
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  local_168._M_string_length = 0;
  local_168.field_2._M_local_buf[0] = '\0';
  this_00 = (Document *)operator_new(0x38);
  Document::Document(this_00,(string *)&this->field_0x8);
  *(Document **)&this->field_0x230 = this_00;
  local_98.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_begin._M_current = (char *)0x0;
  local_98.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_50,"^[0-9]+\\) ",0x10);
  puVar1 = &this->field_0x28;
  local_148 = wresize;
  local_e0 = __cxa_pure_virtual;
  local_130 = memcpy;
  local_138 = (code *)&boost::program_options::error_with_option_name::vtable;
  local_f0 = std::istream::_M_extract<long>;
  local_100 = wattr_on;
  local_108 = DisplayDriver::DisplayDriver;
  local_f8 = std::locale::id::_M_id;
  local_e8 = wattr_get;
  pPVar8 = (Paragraph *)0x0;
  local_140 = (LineElement *)0x0;
  local_170 = this;
LAB_001249f4:
  do {
    while( true ) {
      cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)puVar1 + -0x18) + (char)puVar1);
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)puVar1,(string *)&local_168,cVar4);
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
        if (pPVar8 != (Paragraph *)0x0) {
          lVar9 = Paragraph::size();
          if (lVar9 != 0) {
            Document::append_paragraph(*(Paragraph **)&local_170->field_0x230);
          }
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
        if (local_98.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_98.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_98.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,
                          CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                   local_168.field_2._M_local_buf[0]) + 1);
        }
        return;
      }
      if (local_168._M_string_length != 0) break;
      if (pPVar8 != (Paragraph *)0x0) {
        lVar9 = Paragraph::size();
        if (lVar9 != 0) {
          Document::append_paragraph(*(Paragraph **)&local_170->field_0x230);
        }
      }
      pPVar8 = (Paragraph *)operator_new(0x28);
      *(undefined8 *)(pPVar8 + 0x10) = 0;
      *(undefined8 *)(pPVar8 + 0x18) = 0;
      *(undefined8 *)pPVar8 = 0;
      *(undefined8 *)(pPVar8 + 8) = 0;
      *(undefined8 *)(pPVar8 + 0x20) = 0;
      Paragraph::Paragraph(pPVar8);
LAB_00124f9a:
      *(code **)pPVar8 = local_148;
    }
    uVar12 = 0;
    do {
      uVar11 = uVar12;
      uVar12 = uVar11 + 1;
      if (local_168._M_string_length <= uVar11) break;
    } while (local_168._M_dataplus._M_p[uVar11] == '#');
    if (pPVar8 == (Paragraph *)0x0) {
      pPVar8 = (Paragraph *)operator_new(0x28);
      *(undefined8 *)(pPVar8 + 0x10) = 0;
      *(undefined8 *)(pPVar8 + 0x18) = 0;
      *(undefined8 *)pPVar8 = 0;
      *(undefined8 *)(pPVar8 + 8) = 0;
      *(undefined8 *)(pPVar8 + 0x20) = 0;
      Paragraph::Paragraph(pPVar8);
      *(code **)pPVar8 = local_148;
    }
    std::__cxx11::string::substr((ulong)&local_190,(ulong)&local_168);
    iVar6 = std::__cxx11::string::compare((char *)&local_190);
    if ((iVar6 == 0) || (*local_168._M_dataplus._M_p == '\t')) {
      lVar9 = Paragraph::size();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,
                        CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                                 local_190.field_2._M_local_buf[0]) + 1);
      }
      if (lVar9 == 0) {
        Paragraph::~Paragraph(pPVar8);
        operator_delete(pPVar8,0x28);
        pPVar8 = (Paragraph *)operator_new(0x28);
        Paragraph::Paragraph(pPVar8);
        *(code **)pPVar8 = local_e0;
        std::__cxx11::string::substr((ulong)&local_190,(ulong)&local_168);
        iVar6 = std::__cxx11::string::compare((char *)&local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,
                          CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                                   local_190.field_2._M_local_buf[0]) + 1);
        }
        if (iVar6 == 0) {
          std::__cxx11::string::substr((ulong)&local_190,(ulong)&local_168);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_190,(ulong)&local_168);
        }
        std::__cxx11::string::operator=((string *)&local_168,(string *)&local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,
                          CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                                   local_190.field_2._M_local_buf[0]) + 1);
        }
        this_01 = (CodeLineElement *)operator_new(0x28);
        CodeLineElement::CodeLineElement(this_01,(string *)&local_168);
        (*(code *)**(undefined8 **)pPVar8)(pPVar8,this_01);
        Document::append_paragraph(*(Paragraph **)&local_170->field_0x230);
        pPVar8 = (Paragraph *)operator_new(0x28);
        *(undefined8 *)(pPVar8 + 0x10) = 0;
        *(undefined8 *)(pPVar8 + 0x18) = 0;
        *(undefined8 *)pPVar8 = 0;
        *(undefined8 *)(pPVar8 + 8) = 0;
        *(undefined8 *)(pPVar8 + 0x20) = 0;
        Paragraph::Paragraph(pPVar8);
        goto LAB_00124f9a;
      }
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,
                      CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                               local_190.field_2._M_local_buf[0]) + 1);
    }
    if (uVar12 == 1) {
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,">","");
      if (local_168._M_string_length < local_190._M_string_length) {
LAB_00124da2:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,
                          CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                                   local_190.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        uVar12 = 0;
        do {
          uVar11 = uVar12 + 1;
          if (local_190._M_string_length <= uVar12) break;
          pcVar2 = local_190._M_dataplus._M_p + uVar12;
          pcVar3 = local_168._M_dataplus._M_p + uVar12;
          uVar12 = uVar11;
        } while (*pcVar3 == *pcVar2);
        if (local_190._M_string_length + 1 != uVar11) goto LAB_00124da2;
        lVar9 = Paragraph::size();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,
                          CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                                   local_190.field_2._M_local_buf[0]) + 1);
        }
        if (lVar9 == 0) {
          Paragraph::~Paragraph(pPVar8);
          operator_delete(pPVar8,0x28);
          pPVar8 = (Paragraph *)operator_new(0x28);
          Paragraph::Paragraph(pPVar8);
          *(code **)pPVar8 = local_f8;
          std::__cxx11::string::substr((ulong)&local_190,(ulong)&local_168);
          lVar9 = std::__cxx11::string::find_first_not_of((char *)&local_190,0x134df7,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,
                            CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                                     local_190.field_2._M_local_buf[0]) + 1);
          }
          if (lVar9 == -1) {
            local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_190," ","");
            parse_line(local_170,pPVar8,&local_190);
          }
          else {
            std::__cxx11::string::substr((ulong)&local_190,(ulong)&local_168);
            parse_line(local_170,pPVar8,&local_190);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,
                            CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                                     local_190.field_2._M_local_buf[0]) + 1);
          }
          Document::append_paragraph(*(Paragraph **)&local_170->field_0x230);
          pPVar8 = (Paragraph *)operator_new(0x28);
          *(undefined8 *)(pPVar8 + 0x10) = 0;
          *(undefined8 *)(pPVar8 + 0x18) = 0;
          *(undefined8 *)pPVar8 = 0;
          *(undefined8 *)(pPVar8 + 8) = 0;
          *(undefined8 *)(pPVar8 + 0x20) = 0;
          Paragraph::Paragraph(pPVar8);
          goto LAB_00124f9a;
        }
      }
      cVar4 = (char)&local_168;
      lVar9 = std::__cxx11::string::find_first_not_of(cVar4,0x3d);
      if (lVar9 == -1) {
        this_02 = (Paragraph *)operator_new(0x28);
        Paragraph::Paragraph(this_02,pPVar8);
        pcVar10 = local_130;
      }
      else {
        lVar9 = std::__cxx11::string::find_first_not_of(cVar4,0x2d);
        if (lVar9 != -1) {
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"* ","");
          if (local_168._M_string_length < local_190._M_string_length) {
            bVar5 = false;
          }
          else {
            uVar12 = 0;
            do {
              uVar11 = uVar12 + 1;
              if (local_190._M_string_length <= uVar12) break;
              pcVar2 = local_190._M_dataplus._M_p + uVar12;
              pcVar3 = local_168._M_dataplus._M_p + uVar12;
              uVar12 = uVar11;
            } while (*pcVar3 == *pcVar2);
            bVar5 = local_190._M_string_length + 1 == uVar11;
          }
          bVar13 = true;
          if (!bVar5) {
            local_b8 = local_a8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"- ","");
            if (local_168._M_string_length < local_b0) {
              bVar13 = false;
            }
            else {
              uVar12 = 0;
              do {
                uVar11 = uVar12 + 1;
                if (local_b0 <= uVar12) break;
                pcVar2 = (char *)((long)local_b8 + uVar12);
                pcVar3 = local_168._M_dataplus._M_p + uVar12;
                uVar12 = uVar11;
              } while (*pcVar3 == *pcVar2);
              bVar13 = local_b0 + 1 == uVar11;
            }
          }
          if ((!bVar5) && (local_b8 != local_a8)) {
            operator_delete(local_b8,local_a8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,
                            CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                                     local_190.field_2._M_local_buf[0]) + 1);
          }
          if (bVar13) {
            lVar9 = Paragraph::size();
            if (lVar9 != 0) {
              Document::append_paragraph(*(Paragraph **)&local_170->field_0x230);
            }
            pPVar8 = (Paragraph *)operator_new(0x28);
            Paragraph::Paragraph(pPVar8);
            *(code **)pPVar8 = local_f0;
            std::__cxx11::string::substr((ulong)&local_190,(ulong)&local_168);
            parse_line(local_170,pPVar8,&local_190);
          }
          else {
            local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"  * ","");
            if (local_168._M_string_length < local_190._M_string_length) {
              bVar5 = false;
            }
            else {
              uVar12 = 0;
              do {
                uVar11 = uVar12 + 1;
                if (local_190._M_string_length <= uVar12) break;
                pcVar2 = local_190._M_dataplus._M_p + uVar12;
                pcVar3 = local_168._M_dataplus._M_p + uVar12;
                uVar12 = uVar11;
              } while (*pcVar3 == *pcVar2);
              bVar5 = local_190._M_string_length + 1 == uVar11;
            }
            bVar13 = true;
            if (!bVar5) {
              local_d8 = local_c8;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"  - ","");
              if (local_168._M_string_length < local_d0) {
                bVar13 = false;
              }
              else {
                uVar12 = 0;
                do {
                  uVar11 = uVar12 + 1;
                  if (local_d0 <= uVar12) break;
                  pcVar2 = (char *)((long)local_d8 + uVar12);
                  pcVar3 = local_168._M_dataplus._M_p + uVar12;
                  uVar12 = uVar11;
                } while (*pcVar3 == *pcVar2);
                bVar13 = local_d0 + 1 == uVar11;
              }
            }
            if ((!bVar5) && (local_d8 != local_c8)) {
              operator_delete(local_d8,local_c8[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
              operator_delete(local_190._M_dataplus._M_p,
                              CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                                       local_190.field_2._M_local_buf[0]) + 1);
            }
            if (bVar13) {
              lVar9 = Paragraph::size();
              if (lVar9 != 0) {
                Document::append_paragraph(*(Paragraph **)&local_170->field_0x230);
              }
              pPVar8 = (Paragraph *)operator_new(0x28);
              Paragraph::Paragraph(pPVar8);
              *(code **)pPVar8 = local_100;
              std::__cxx11::string::substr((ulong)&local_190,(ulong)&local_168);
              parse_line(local_170,pPVar8,&local_190);
            }
            else {
              bVar5 = std::__detail::
                      __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_168._M_dataplus._M_p,
                                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )(local_168._M_dataplus._M_p + local_168._M_string_length),
                                 &local_98,&local_50,0);
              if (!bVar5) {
                lVar9 = Paragraph::size();
                bVar5 = local_140 == (LineElement *)0x0;
                if (bVar5 || lVar9 == 0) {
LAB_0012546b:
                  bVar13 = false;
                }
                else {
                  (**(code **)(*(long *)local_140 + 0x10))(&local_70);
                  if (*(char *)((long)local_70 + local_68 + -1) == ' ') goto LAB_0012546b;
                  bVar13 = *local_168._M_dataplus._M_p != ' ';
                }
                if ((!bVar5 && lVar9 != 0) && (local_70 != local_60)) {
                  operator_delete(local_70,local_60[0] + 1);
                }
                if (bVar13) {
                  std::operator+(&local_190," ",&local_168);
                  std::__cxx11::string::operator=((string *)&local_168,(string *)&local_190);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_190._M_dataplus._M_p != &local_190.field_2) {
                    operator_delete(local_190._M_dataplus._M_p,
                                    CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                                             local_190.field_2._M_local_buf[0]) + 1);
                  }
                }
                local_140 = parse_line(local_170,pPVar8,&local_168);
                goto LAB_001249f4;
              }
              lVar9 = Paragraph::size();
              if (lVar9 != 0) {
                Document::append_paragraph(*(Paragraph **)&local_170->field_0x230);
              }
              pPVar8 = (Paragraph *)operator_new(0x28);
              Paragraph::Paragraph(pPVar8);
              *(code **)pPVar8 = local_108;
              std::__cxx11::string::find_first_not_of((char *)&local_168,0x134dff,0);
              std::__cxx11::string::substr((ulong)&local_190,(ulong)&local_168);
              parse_line(local_170,pPVar8,&local_190);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,
                            CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                                     local_190.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_001249f4;
        }
        this_02 = (Paragraph *)operator_new(0x28);
        Paragraph::Paragraph(this_02,pPVar8);
        pcVar10 = local_138;
      }
      *(code **)this_02 = pcVar10;
      Paragraph::~Paragraph(pPVar8);
      operator_delete(pPVar8,0x28);
      Document::append_paragraph(*(Paragraph **)&local_170->field_0x230);
      pPVar8 = (Paragraph *)0x0;
      goto LAB_001249f4;
    }
    local_128[0] = local_118;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"\t #","");
    lVar9 = std::__cxx11::string::find_first_not_of((char *)&local_168,(ulong)local_128[0],0);
    if (lVar9 == -1) {
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      local_190._M_string_length = 0;
      local_190.field_2._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::substr((ulong)&local_190,(ulong)&local_168);
    }
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,
                      CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                               local_190.field_2._M_local_buf[0]) + 1);
    }
    if (local_128[0] != local_118) {
      operator_delete(local_128[0],local_118[0] + 1);
    }
    if (uVar11 == 1) {
      Paragraph::~Paragraph(pPVar8);
      operator_delete(pPVar8,0x28);
      pPVar8 = (Paragraph *)operator_new(0x28);
      Paragraph::Paragraph(pPVar8);
      pcVar10 = local_130;
LAB_00125008:
      *(code **)pPVar8 = pcVar10;
    }
    else {
      if (uVar11 == 2) {
        Paragraph::~Paragraph(pPVar8);
        operator_delete(pPVar8,0x28);
        pPVar8 = (Paragraph *)operator_new(0x28);
        Paragraph::Paragraph(pPVar8);
        pcVar10 = local_138;
        goto LAB_00125008;
      }
      if (uVar12 == 4) {
        Paragraph::~Paragraph(pPVar8);
        operator_delete(pPVar8,0x28);
        pPVar8 = (Paragraph *)operator_new(0x28);
        Paragraph::Paragraph(pPVar8);
        pcVar10 = local_e8;
        goto LAB_00125008;
      }
    }
    parse_line(local_170,pPVar8,&local_168);
  } while( true );
}

Assistant:

void MdParser::parse() {
	std::string line;
	_document = new Document(_filename);
	Paragraph *current_p(nullptr), *temp_p(nullptr);
	LineElement *last_e = nullptr;
	size_t sharps(0);

	smatch match;
	regex olist1_regex("^[0-9]+\\) ");

	while (getline(_input_file, line)) {
		if (line.empty()) {
			// end of line, change paragraph
			if (current_p and current_p->size()) {
				_document->append_paragraph(current_p);
			}
			current_p = new TextParagraph();
		} else {
			sharps = string_startswith(line, '#');

			if (!current_p) {
				current_p = new TextParagraph();
			}

			if ( (line.substr(0, 4) == "    " or line[0] == '\t') and (!current_p or !current_p->size()) ) {
				// This is a code paragraph
				delete current_p;
				current_p = new CodeParagraph();
				if (line.substr(0, 4) == "    ") {
					line = line.substr(4);
				} else {
					line = line.substr(1);
				}
				current_p->append_line_element(new CodeLineElement(line));
				_document->append_paragraph(current_p);
				current_p = new TextParagraph();
			} else if (sharps != 0) {
				line = string_clear_leading(line, "\t #");
				switch(sharps) {
					case 1:
						delete current_p;
						current_p = new Title1Paragraph();
						break;
					case 2:
						delete current_p;
						current_p = new Title2Paragraph();
						break;
					case 3:
						delete current_p;
						current_p = new Title3Paragraph();
						break;
					default:
						break;
				}
				parse_line(current_p, line);
			} else if (string_startswith(line, ">") and (!current_p or !current_p->size())) {
				delete current_p;
				current_p = new QuoteParagraph();
				if (line.substr(1).find_first_not_of("\t ") == string::npos) {
					parse_line(current_p, " ");
				} else {
					parse_line(current_p, line.substr(2));
				}
				_document->append_paragraph(current_p);
				current_p = new TextParagraph();
			} else if (string_has_only(line, '=')) { // title 1 delimiter
				temp_p = new Title1Paragraph(current_p);
				delete current_p;
				current_p = nullptr;
				_document->append_paragraph(temp_p);
			} else if (string_has_only(line, '-')) { // title 2 delimiter
				temp_p = new Title2Paragraph(current_p);
				delete current_p;
				current_p = nullptr;
				_document->append_paragraph(temp_p);
			} else if (string_startswith(line, "* ") or string_startswith(line, "- ")) { // level 1 list delimiter
				if (current_p->size()) {
					_document->append_paragraph(current_p);
				}
				current_p = new UList1Paragraph();
				parse_line(current_p, line.substr(2));
			} else if (string_startswith(line, "  * ") or string_startswith(line, "  - ")) { // level 2 list delimiter
				if (current_p->size()) {
					_document->append_paragraph(current_p);
				}
				current_p = new UList2Paragraph();
				parse_line(current_p, line.substr(4));
			} else if (regex_search(line, match, olist1_regex)) { // ordered list level 1
				if (current_p->size()) {
					_document->append_paragraph(current_p);
				}
				current_p = new OList1Paragraph();
				parse_line(current_p, line.substr(line.find_first_not_of("0123456789)")+1));
			} else {
				// other content
				if (current_p->size() && last_e && (last_e->content()).back() != ' ' && line.front() != ' ') {
					line = " "+line;
				}
				last_e = parse_line(current_p, line);
			}
		}
	}

	if (current_p and current_p->size()) {
		_document->append_paragraph(current_p);
	}
}